

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::TSPI_PDU::Encode(TSPI_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *stream_00;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  TSPI_PDU *this_local;
  
  LE_Header::Encode(&this->super_LE_Header,stream);
  stream_00 = KDataStream::operator<<(stream,(this->m_TSPIFlagUnion).m_ui8Flag);
  DATA_TYPE::operator<<(stream_00,&(this->m_Loc).super_DataTypeBase);
  if (((this->m_TSPIFlagUnion).m_ui8Flag & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_LinVel).super_DataTypeBase);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 1 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_Ori).super_DataTypeBase);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 2 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_PosErr).super_DataTypeBase);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 3 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_OriErr).super_DataTypeBase);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 4 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_DeadReckoningParameter).super_DataTypeBase);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 5 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_MeasureSpd).super_DataTypeBase);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 6 & 1) != 0) {
    KDataStream::operator<<(stream,this->m_ui8SSDLen);
    citrEnd = std::vector<char,_std::allocator<char>_>::begin(&this->m_vSSD);
    local_28._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&this->m_vSSD);
    while (bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28), bVar1) {
      pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&citrEnd);
      KDataStream::operator<<(stream,*pcVar2);
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator++(&citrEnd);
    }
  }
  return;
}

Assistant:

void TSPI_PDU::Encode( KDataStream & stream ) const
{

    LE_Header::Encode( stream );

    stream << m_TSPIFlagUnion.m_ui8Flag
           << KDIS_STREAM m_Loc;

    if( m_TSPIFlagUnion.m_ui8LinVel )
    {
        stream << KDIS_STREAM m_LinVel;
    }

    if( m_TSPIFlagUnion.m_ui8Ori )
    {
        stream << KDIS_STREAM m_Ori;
    }

    if( m_TSPIFlagUnion.m_ui8PosErr )
    {
        stream << KDIS_STREAM m_PosErr;
    }

    if( m_TSPIFlagUnion.m_ui8OriErr )
    {
        stream << KDIS_STREAM m_OriErr;
    }

    if( m_TSPIFlagUnion.m_ui8DRM )
    {
        stream << KDIS_STREAM m_DeadReckoningParameter;
    }

    if( m_TSPIFlagUnion.m_ui8Spd )
    {
        stream << KDIS_STREAM m_MeasureSpd;
    }

    if( m_TSPIFlagUnion.m_ui8Data )
    {
        stream << m_ui8SSDLen;

        // Encode System Specific Data
        vector<KOCTET>::const_iterator citr = m_vSSD.begin();
        vector<KOCTET>::const_iterator citrEnd = m_vSSD.end();
        for( ; citr != citrEnd; ++citr )
        {
            stream << *citr;
        }
    }
}